

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmWin.c
# Opt level: O2

int Sfm_ObjMffcSize(Sfm_Ntk_t *p,int iObj)

{
  uint __line;
  int iVar1;
  int iVar2;
  char *__assertion;
  
  if ((p->nPis <= iObj) && (iVar1 = Sfm_ObjFanoutNum(p,iObj), iVar1 == 1)) {
    if ((iObj < p->nPis) || (p->nObjs <= p->nPos + iObj)) {
      __assertion = "Sfm_ObjIsNode( p, iObj )";
      __line = 0x60;
    }
    else {
      iVar1 = Sfm_ObjDeref(p,iObj);
      iVar2 = Sfm_ObjRef(p,iObj);
      if (iVar1 == iVar2) {
        return iVar1;
      }
      __assertion = "Count1 == Count2";
      __line = 99;
    }
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmWin.c"
                  ,__line,"int Sfm_ObjMffcSize(Sfm_Ntk_t *, int)");
  }
  return 0;
}

Assistant:

int Sfm_ObjMffcSize( Sfm_Ntk_t * p, int iObj )
{
    int Count1, Count2;
    if ( Sfm_ObjIsPi(p, iObj) )
        return 0;
    if ( Sfm_ObjFanoutNum(p, iObj) != 1 )
        return 0;
    assert( Sfm_ObjIsNode( p, iObj ) );
    Count1 = Sfm_ObjDeref( p, iObj );
    Count2 = Sfm_ObjRef( p, iObj );
    assert( Count1 == Count2 );
    return Count1;
}